

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O0

VCONTROLLER * create_keyboard_controller(char *config_path)

{
  VCONTROLLER *pVVar1;
  void *pvVar2;
  VCONTROLLER *ret;
  int i;
  char *in_stack_00000048;
  VCONTROLLER *in_stack_00000050;
  int local_c;
  
  pVVar1 = (VCONTROLLER *)malloc(0x50);
  pvVar2 = malloc(0xc);
  pVVar1->private_data = pvVar2;
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    pVVar1->button[local_c] = 0;
    *(undefined4 *)((long)pVVar1->private_data + (long)local_c * 4) = 0;
  }
  pVVar1->poll = poll;
  pVVar1->calibrate_button = calibrate_button;
  pVVar1->get_button_description = get_button_description;
  pVVar1->read_config = read_config;
  pVVar1->write_config = write_config;
  read_config(in_stack_00000050,in_stack_00000048);
  return pVVar1;
}

Assistant:

VCONTROLLER *create_keyboard_controller(const char *config_path)
{
   int i;
   VCONTROLLER *ret = malloc(sizeof(VCONTROLLER));

   ret->private_data = malloc(3 * sizeof(int));
   for (i = 0; i < 3; i++) {
      ret->button[i] = 0;
      ((int *)(ret->private_data))[i] = 0;
   }
   ret->poll = poll;
   ret->calibrate_button = calibrate_button;
   ret->get_button_description = get_button_description;
   ret->read_config = read_config;
   ret->write_config = write_config;

   read_config(ret, config_path);

   return ret;
}